

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O1

void helper_booke206_tlbivax_ppc64(CPUPPCState_conflict2 *env,target_ulong address)

{
  _func_void_DisasContext_ptr_int_int **cpu;
  int iVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ppc6xx_tlb_t_conflict2 *ppVar9;
  bool bVar10;
  
  if ((address & 4) != 0) {
    bVar10 = (address & 8) != 0;
    if (bVar10) {
      iVar6 = 2;
    }
    else {
      iVar6 = 1;
    }
    booke206_flush_tlb(env,iVar6,(uint)bVar10);
    return;
  }
  cpu = &env[-1].spr_cb[0x1bf].oea_write;
  uVar5 = (uint)address;
  if ((address & 8) == 0) {
    uVar7 = (uint)env->spr[0x2b0];
    if (0xffffff < uVar7) {
      uVar8 = uVar7 >> 0x18;
      iVar6 = 0;
      if (uVar8 != 0) {
        for (; (uVar8 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
        }
      }
      uVar7 = uVar7 & 0xfff;
      if (uVar7 == 0) {
        cVar2 = '\0';
      }
      else {
        iVar1 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> iVar1 & 1) == 0; iVar1 = iVar1 + 1) {
          }
        }
        cVar2 = (char)iVar1;
      }
      uVar4 = 0;
      do {
        uVar3 = uVar4 & uVar8 + 0x7fffffff |
                (~(-1 << (cVar2 - (byte)iVar6 & 0x1f)) & (uint)(address >> 0xc) & 0xfffff) <<
                ((byte)iVar6 & 0x1f);
        if (uVar3 < uVar7) {
          ppVar9 = (env->tlb).tlb6 + uVar3;
        }
        else {
          ppVar9 = (ppc6xx_tlb_t_conflict2 *)0x0;
        }
        if (ppVar9 != (ppc6xx_tlb_t_conflict2 *)0x0) {
          uVar3 = *(uint *)((long)&ppVar9->pte0 + 4);
          if (((uVar3 >> 0x1e & 1) == 0) &&
             ((ppVar9->pte1 & 0xfffffffffffff000) ==
              (ulong)(-0x400 << ((byte)(uVar3 >> 7) & 0x1f) & uVar5 & 0xfffffc00))) {
            *(uint *)((long)&ppVar9->pte0 + 4) = uVar3 & 0x3fffffff;
          }
        }
        uVar4 = uVar4 + 1;
      } while (uVar8 + (uVar8 == 0) != uVar4);
    }
    tlb_flush_page_ppc64((CPUState *)cpu,address & 0xfffffffffffff000);
    return;
  }
  uVar7 = (uint)env->spr[0x2b1];
  if (0xffffff < uVar7) {
    uVar8 = uVar7 >> 0x18;
    iVar6 = 0;
    if (uVar8 != 0) {
      for (; (uVar8 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
      }
    }
    uVar7 = uVar7 & 0xfff;
    if (uVar7 == 0) {
      cVar2 = '\0';
    }
    else {
      iVar1 = 0;
      if (uVar7 != 0) {
        for (; (uVar7 >> iVar1 & 1) == 0; iVar1 = iVar1 + 1) {
        }
      }
      cVar2 = (char)iVar1;
    }
    uVar4 = 0;
    do {
      uVar3 = uVar4 & uVar8 + 0x7fffffff |
              (~(-1 << (cVar2 - (byte)iVar6 & 0x1f)) & uVar5 >> 0xc) << ((byte)iVar6 & 0x1f);
      if (uVar3 < uVar7) {
        ppVar9 = (env->tlb).tlb6 + (((uint)env->spr[0x2b0] & 0xfff) + uVar3);
      }
      else {
        ppVar9 = (ppc6xx_tlb_t_conflict2 *)0x0;
      }
      if (ppVar9 != (ppc6xx_tlb_t_conflict2 *)0x0) {
        uVar3 = *(uint *)((long)&ppVar9->pte0 + 4);
        if (((uVar3 >> 0x1e & 1) == 0) &&
           ((ppVar9->pte1 & 0xfffffffffffff000) ==
            (ulong)(-0x400 << ((byte)(uVar3 >> 7) & 0x1f) & uVar5 & 0xfffffc00))) {
          *(uint *)((long)&ppVar9->pte0 + 4) = uVar3 & 0x3fffffff;
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar8 + (uVar8 == 0) != uVar4);
  }
  tlb_flush_ppc64((CPUState *)cpu);
  return;
}

Assistant:

void helper_booke206_tlbivax(CPUPPCState *env, target_ulong address)
{
    CPUState *cs = env_cpu(env);

    if (address & 0x4) {
        /* flush all entries */
        if (address & 0x8) {
            /* flush all of TLB1 */
            booke206_flush_tlb(env, BOOKE206_FLUSH_TLB1, 1);
        } else {
            /* flush all of TLB0 */
            booke206_flush_tlb(env, BOOKE206_FLUSH_TLB0, 0);
        }
        return;
    }

    if (address & 0x8) {
        /* flush TLB1 entries */
        booke206_invalidate_ea_tlb(env, 1, address);
        tlb_flush(cs);
    } else {
        /* flush TLB0 entries */
        booke206_invalidate_ea_tlb(env, 0, address);
        tlb_flush_page(cs, address & MAS2_EPN_MASK);
    }
}